

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_RUBBLE(effect_handler_context_t_conflict *context)

{
  ulong uVar1;
  player_upkeep *ppVar2;
  chunk_conflict *c;
  _Bool _Var3;
  wchar_t wVar4;
  wchar_t wVar5;
  uint32_t uVar6;
  loc grid;
  wchar_t d;
  long lVar7;
  uint uVar8;
  wchar_t local_44;
  
  wVar4 = Rand_div(3);
  uVar8 = 0;
  wVar5 = count_feats((loc *)0x0,square_isempty,false);
  local_44 = wVar4 + L'\x01';
  if (wVar5 <= wVar4) {
    local_44 = wVar5;
  }
  for (; (L'\0' < local_44 && (uVar8 < 10)); uVar8 = uVar8 + 1) {
    for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
      grid = (loc)loc_sum(player->grid,(loc_conflict)ddgrid_ddd[lVar7]);
      _Var3 = square_in_bounds_fully(cave,grid);
      if (((_Var3) && (_Var3 = square_isempty(cave,grid), _Var3)) &&
         (uVar6 = Rand_div(3), uVar6 == 0)) {
        uVar6 = Rand_div(2);
        square_set_feat(cave,grid,(uint)(uVar6 == 0) * 8 + L'\x10');
        c = cave;
        if (cave->depth == 0) {
          _Var3 = is_daytime();
          expose_to_sun((chunk *)c,grid,_Var3);
        }
        local_44 = local_44 + L'\xffffffff';
      }
    }
  }
  context->ident = true;
  ppVar2 = player->upkeep;
  uVar1._0_4_ = ppVar2->update;
  uVar1._4_4_ = ppVar2->redraw;
  ppVar2->update = (int)(uVar1 | 0xc0000000000060);
  ppVar2->redraw = (int)((uVar1 | 0xc0000000000060) >> 0x20);
  return true;
}

Assistant:

bool effect_handler_RUBBLE(effect_handler_context_t *context)
{
	/*
	 * First we work out how many grids we want to fill with rubble.  Then we
	 * check that we can actually do this, by counting the number of grids
	 * available, limiting the number of rubble grids to this number if
	 * necessary.
	 */
	int rubble_grids = randint1(3);
	int open_grids = count_feats(NULL, square_isempty, false);

	if (rubble_grids > open_grids) {
		rubble_grids = open_grids;
	}

	/* Avoid infinite loops */
	int iterations = 0;

	while (rubble_grids > 0 && iterations < 10) {
		/* Look around the player */
		for (int d = 0; d < 8; d++) {
			/* Extract adjacent (legal) location */
			struct loc grid = loc_sum(player->grid, ddgrid_ddd[d]);
			if (!square_in_bounds_fully(cave, grid)) continue;
			if (!square_isempty(cave, grid)) continue;

			if (one_in_(3)) {
				if (one_in_(2))
					square_set_feat(cave, grid, FEAT_PASS_RUBBLE);
				else
					square_set_feat(cave, grid, FEAT_RUBBLE);
				if (cave->depth == 0)
					expose_to_sun(cave, grid, is_daytime());
				rubble_grids--;
			}
		}

		iterations++;
	}

	context->ident = true;

	/* Fully update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

	/* Redraw monster list */
	player->upkeep->redraw |= (PR_MONLIST | PR_ITEMLIST);

	return true;
}